

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

double __thiscall
imrt::EvaluationFunction::get_delta_eval
          (EvaluationFunction *this,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff,double angle,
          vector<double,_std::allocator<double>_> *w,vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,int n_voxels)

{
  double dVar1;
  double dVar2;
  int iVar3;
  Matrix *pMVar4;
  _Base_ptr p_Var5;
  _List_node_base *p_Var6;
  int iVar7;
  iterator __end2;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_58;
  
  p_Var5 = (this->voxels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar7 = 0;
  local_58 = 0.0;
  do {
    if ((_Rb_tree_header *)p_Var5 == &(this->voxels)._M_t._M_impl.super__Rb_tree_header) {
      return local_58;
    }
    iVar3 = *(int *)&p_Var5[1]._M_parent;
    lVar8 = (long)*(int *)((long)&p_Var5[1]._M_parent + 4);
    pMVar4 = Volume::getDepositionMatrix
                       ((this->volumes->
                        super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
                        super__Vector_impl_data._M_start + iVar3,(int)angle);
    dVar9 = 0.0;
    p_Var6 = (_List_node_base *)diff;
    while (p_Var6 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)diff) {
      dVar9 = dVar9 + pMVar4->p[lVar8][*(int *)&p_Var6[1]._M_next] * (double)p_Var6[1]._M_prev;
    }
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      dVar10 = *(double *)
                (*(long *)&(this->Z).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar3].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data + lVar8 * 8);
      dVar1 = (Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar3];
      dVar12 = dVar9 + dVar10;
      if (dVar1 <= dVar10) {
        dVar11 = 0.0;
        if (dVar12 < dVar1) {
          dVar11 = (dVar1 - dVar12) * (dVar1 - dVar12) *
                   (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar3] + 0.0;
        }
      }
      else {
        dVar11 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar3];
        if (dVar1 <= dVar12) {
          dVar11 = 0.0 - dVar11 * (dVar1 - dVar10) * (dVar1 - dVar10);
        }
        else {
          dVar11 = ((dVar10 - dVar1) + (dVar10 - dVar1) + dVar9) * dVar11 * dVar9 + 0.0;
        }
      }
      dVar1 = (Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar3];
      if (dVar10 <= dVar1) {
        if (dVar1 < dVar12) {
          dVar11 = dVar11 + (dVar12 - dVar1) * (dVar12 - dVar1) *
                            (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[iVar3];
        }
      }
      else {
        dVar2 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar3];
        dVar10 = dVar10 - dVar1;
        if (dVar12 <= dVar1) {
          dVar11 = dVar11 - dVar2 * dVar10 * dVar10;
        }
        else {
          dVar11 = dVar11 + (dVar10 + dVar10 + dVar9) * dVar2 * dVar9;
        }
      }
      local_58 = local_58 +
                 dVar11 / (double)(this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar3];
      if (n_voxels <= iVar7) {
        return local_58;
      }
      iVar7 = iVar7 + 1;
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

double EvaluationFunction::get_delta_eval(list< pair< int, double > >& diff, double angle,
                                          vector<double>& w, vector<double>& Zmin, 
                                          vector<double>& Zmax,int n_voxels) const{
  
  double delta_F=0.0;
  int b;
  double delta_intensity, delta;
  
  int i=0;
  for(auto voxel:voxels){
    int o=voxel.second.first;
    int k=voxel.second.second;
    const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
    
    delta = 0;
    for (auto let:diff){
      b = let.first;
      delta_intensity = let.second;
      delta = delta + Dep(k,b)*(delta_intensity);
    }
    if(delta==0.0) continue;
    
    double pen=0.0;
    //with the change in the dose of a voxel we can incrementally modify the value of F
    if(Z[o][k] < Zmin[o] && Z[o][k] + delta < Zmin[o]) //update the penalty
      pen += w[o]*delta*(delta+2*(Z[o][k]-Zmin[o]));
    else if(Z[o][k] < Zmin[o]) //the penalty disappears
      pen -=  w[o] * ( pow(Zmin[o]-Z[o][k], 2) );
    else if(Z[o][k] + delta < Zmin[o]) //the penalty appears
      pen +=  w[o] * ( pow(Zmin[o]-(Z[o][k]+delta), 2) );
    
    if(Z[o][k] > Zmax[o] && Z[o][k] + delta > Zmax[o]) //update the penalty
      pen += w[o]*delta*(delta+2*(-Zmax[o] + Z[o][k]));
    else if(Z[o][k] > Zmax[o]) //the penalty disappears
      pen -=  w[o] * ( pow(Z[o][k]-Zmax[o], 2) );
    else if(Z[o][k] + delta > Zmax[o]) //the penalty appears
      pen +=  w[o] * ( pow(Z[o][k]+delta - Zmax[o], 2) );
    
    delta_F += pen/nb_voxels[o];
    i++; if(i>n_voxels) break;
  }
  return delta_F;
}